

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
iterate(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        *this)

{
  int iVar1;
  deUint32 dVar2;
  IterateResult IVar3;
  deUint32 dVar4;
  deBool dVar5;
  undefined4 extraout_var;
  void *dst;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  undefined4 *puVar10;
  deUint32 bufferIDs [3];
  Random rnd;
  void *local_78;
  deRandom local_68;
  deRandom local_58;
  undefined8 local_48;
  ulong local_38;
  long lVar6;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  if (this->m_useGL == true) {
    if (Performance::(anonymous_namespace)::
        BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        ::iterate()::buffersWarmedUp == '\0') {
      local_78 = operator_new(0x1000000);
      memset(local_78,0,0x1000000);
      deRandom_init(&local_68,0x1234);
      local_58.x = 0;
      local_58.y = 0;
      local_58.z = 0;
      local_58.w = 0;
      local_48 = 0;
      (**(code **)(lVar6 + 0x1680))((this->m_dummyProgram->m_program).m_program);
      (**(code **)(lVar6 + 0x1a00))(0,0,0x20,0x20);
      (**(code **)(lVar6 + 0x610))(this->m_dummyProgramPosLoc);
      uVar7 = 0;
      do {
        lVar8 = 0;
        local_38 = uVar7;
        do {
          dVar4 = deRandom_getUint32(&local_68);
          dVar2 = deRandom_getUint32(&local_68);
          dVar2 = BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  ::iterate::usages[dVar2 % 9];
          puVar10 = (undefined4 *)((long)&local_58.x + lVar8);
          (**(code **)(lVar6 + 0x6c8))(1,puVar10);
          (**(code **)(lVar6 + 0x40))(0x8892,*puVar10);
          uVar9 = (dVar4 & 0xfffff0) + 0x10;
          (**(code **)(lVar6 + 0x150))(0x8892,uVar9,local_78,dVar2);
          dVar5 = deRandom_getBool(&local_68);
          if (dVar5 == 1) {
            (**(code **)(lVar6 + 0x19f0))(this->m_dummyProgramPosLoc,4,0x1406,0,0,0);
            (**(code **)(lVar6 + 0x538))(0,0,1);
            (**(code **)(lVar6 + 0x538))(0,(uVar9 >> 4) - 1,1);
          }
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x18);
        lVar8 = 0;
        do {
          (**(code **)(lVar6 + 0x438))(1,(long)&local_58.x + lVar8);
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x18);
        waitGLResults(this);
        uVar7 = local_38;
        dVar2 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar2,"Buffer gen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                        ,0x808);
        tcu::TestContext::touchWatchdog
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        uVar9 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar9;
      } while (uVar9 != 10);
      Performance::(anonymous_namespace)::
      BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
      ::iterate()::buffersWarmedUp = '\x01';
    }
    else {
      uVar9 = this->m_bufferRandomizerTimer;
      this->m_bufferRandomizerTimer = uVar9 + 1;
      if ((uVar9 & 7) != 0) goto LAB_01329b5f;
      local_78 = operator_new(0x1000000);
      memset(local_78,0,0x1000000);
      deRandom_init(&local_58,this->m_bufferRandomizerTimer * 0xabc + 0x1234);
      local_68.z = 0;
      local_68.x = 0;
      local_68.y = 0;
      lVar8 = 0;
      do {
        dVar4 = deRandom_getUint32(&local_58);
        dVar2 = deRandom_getUint32(&local_58);
        dVar2 = BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ::iterate::usages[dVar2 % 9];
        puVar10 = (undefined4 *)((long)&local_68.x + lVar8);
        (**(code **)(lVar6 + 0x6c8))(1,puVar10);
        (**(code **)(lVar6 + 0x40))(0x8892,*puVar10);
        (**(code **)(lVar6 + 0x150))(0x8892,(dVar4 & 0xfffff0) + 0x10,local_78,dVar2);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      lVar8 = 0;
      do {
        (**(code **)(lVar6 + 0x438))(1,(long)&local_68.x + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      dVar2 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar2,"buffer ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x82d);
      local_68.z = 0;
      local_68.x = 0;
      local_68.y = 0;
      lVar8 = 0;
      do {
        dVar4 = deRandom_getUint32(&local_58);
        dVar2 = deRandom_getUint32(&local_58);
        dVar2 = BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ::iterate::usages[dVar2 % 9];
        puVar10 = (undefined4 *)((long)&local_68.x + lVar8);
        (**(code **)(lVar6 + 0x6c8))(1,puVar10);
        (**(code **)(lVar6 + 0x40))(0x8892,*puVar10);
        uVar9 = (dVar4 & 0xfffff0) + 0x10;
        (**(code **)(lVar6 + 0x150))(0x8892,uVar9,local_78,dVar2);
        (**(code **)(lVar6 + 0x19f0))(this->m_dummyProgramPosLoc,4,0x1406,0,0,0);
        (**(code **)(lVar6 + 0x538))(0,0,1);
        (**(code **)(lVar6 + 0x538))(0,(uVar9 >> 4) - 1,1);
        dVar5 = deRandom_getBool(&local_58);
        if (dVar5 == 1) {
          waitGLResults(this);
        }
        dst = (void *)(**(code **)(lVar6 + 0xd00))(0x8892,0,uVar9,2);
        if (dst != (void *)0x0) {
          medianTimeMemcpy(dst,local_78,uVar9);
          (**(code **)(lVar6 + 0x1670))(0x8892);
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      lVar8 = 0;
      do {
        (**(code **)(lVar6 + 0x438))(1,(long)&local_68.x + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      waitGLResults(this);
      dVar2 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar2,"buffer maps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x852);
    }
    operator_delete(local_78,0x1000000);
    IVar3 = CONTINUE;
  }
  else {
LAB_01329b5f:
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                      (this,(long)this->m_iteration,
                       (this->m_results).
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[this->m_iteration]);
    dVar2 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar2,"post runSample()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                    ,0x85b);
    IVar3 = CONTINUE;
    if ((char)iVar1 != '\0') {
      iVar1 = this->m_iteration + 1;
      this->m_iteration = iVar1;
      if (this->m_numSamples <= iVar1) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,&this->m_results);
        IVar3 = STOP;
      }
    }
  }
  return IVar3;
}

Assistant:

TestCase::IterateResult BasicBufferCase<SampleType>::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	static bool				buffersWarmedUp	= false;

	static const deUint32	usages[] =
	{
		GL_STREAM_DRAW, GL_STREAM_READ, GL_STREAM_COPY,
		GL_STATIC_DRAW, GL_STATIC_READ, GL_STATIC_COPY,
		GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY,
	};

	// Allocate some random sized buffers and remove them to
	// make sure the first samples too have some buffers removed
	// just before their allocation. This is only needed by the
	// the first test.

	if (m_useGL && !buffersWarmedUp)
	{
		const int					numRandomBuffers				= 6;
		const int					numRepeats						= 10;
		const int					maxBufferSize					= 16777216;
		const std::vector<deUint8>	zeroData						(maxBufferSize, 0x00);
		de::Random					rnd								(0x1234);
		deUint32					bufferIDs[numRandomBuffers]		= {0};

		gl.useProgram(m_dummyProgram->getProgram());
		gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
		gl.enableVertexAttribArray(m_dummyProgramPosLoc);

		for (int ndx = 0; ndx < numRepeats; ++ndx)
		{
			// Create buffer and maybe draw from it
			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);

				if (rnd.getBool())
				{
					gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
					gl.drawArrays(GL_POINTS, 0, 1);
					gl.drawArrays(GL_POINTS, randomSize / (int)sizeof(float[4]) - 1, 1);
				}
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);

			waitGLResults();
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer gen");

			m_testCtx.touchWatchdog();
		}

		buffersWarmedUp = true;
		return CONTINUE;
	}
	else if (m_useGL && m_bufferRandomizerTimer++ % 8 == 0)
	{
		// Do some random buffer operations to every now and then
		// to make sure the previous test iterations won't affect
		// following test runs.

		const int					numRandomBuffers				= 3;
		const int					maxBufferSize					= 16777216;
		const std::vector<deUint8>	zeroData						(maxBufferSize, 0x00);
		de::Random					rnd								(0x1234 + 0xabc * m_bufferRandomizerTimer);

		// BufferData
		{
			deUint32 bufferIDs[numRandomBuffers] = {0};

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer ops");

		// Do some memory mappings
		{
			deUint32 bufferIDs[numRandomBuffers] = {0};

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
			{
				const int		randomSize	= deAlign32(rnd.getInt(1, maxBufferSize), 4*4);
				const deUint32	usage		= usages[rnd.getUint32() % (deUint32)DE_LENGTH_OF_ARRAY(usages)];
				void*			ptr;

				gl.genBuffers(1, &bufferIDs[randomBufferNdx]);
				gl.bindBuffer(GL_ARRAY_BUFFER, bufferIDs[randomBufferNdx]);
				gl.bufferData(GL_ARRAY_BUFFER, randomSize, &zeroData[0], usage);

				gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
				gl.drawArrays(GL_POINTS, 0, 1);
				gl.drawArrays(GL_POINTS, randomSize / (int)sizeof(float[4]) - 1, 1);

				if (rnd.getBool())
					waitGLResults();

				ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, randomSize, GL_MAP_WRITE_BIT);
				if (ptr)
				{
					medianTimeMemcpy(ptr, &zeroData[0], randomSize);
					gl.unmapBuffer(GL_ARRAY_BUFFER);
				}
			}

			for (int randomBufferNdx = 0; randomBufferNdx < numRandomBuffers; ++randomBufferNdx)
				gl.deleteBuffers(1, &bufferIDs[randomBufferNdx]);

			waitGLResults();
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer maps");
		return CONTINUE;
	}
	else
	{
		const int	currentIteration	= m_iteration;
		const int	sampleNdx			= m_iterationOrder[currentIteration];
		const bool	sampleRunSuccessful	= runSample(currentIteration, m_results[sampleNdx]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "post runSample()");

		// Retry failed samples
		if (!sampleRunSuccessful)
			return CONTINUE;

		if (++m_iteration >= m_numSamples)
		{
			logAndSetTestResult(m_results);
			return STOP;
		}
		else
			return CONTINUE;
	}
}